

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O1

float Gia_ManComputeSwitching(Gia_Man_t *p,int nFrames,int nPref,int fProbOne)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int *__ptr;
  Vec_Int_t *pVVar6;
  Vec_Int_t *__ptr_00;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  float fVar12;
  
  __ptr_00 = Gia_ManComputeSwitchProbs(p,nFrames,nPref,fProbOne);
  __ptr = __ptr_00->pArray;
  pVVar6 = p->vMapping;
  uVar2 = p->nObjs;
  if (pVVar6 == (Vec_Int_t *)0x0) {
    if ((int)uVar2 < 1) {
LAB_0023117e:
      fVar12 = 0.0;
    }
    else {
      lVar8 = 0;
      lVar10 = 0;
      fVar12 = 0.0;
      do {
        if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_0023117e;
        uVar7 = *(ulong *)(&p->pObjs->field_0x0 + lVar8);
        if ((~(uint)uVar7 & 0x1fffffff) != 0 && -1 < (int)(uint)uVar7) {
          fVar12 = fVar12 + *(float *)((long)__ptr +
                                      ((long)((uVar7 & 0x1fffffff) * -0x100000000 + lVar10) >> 0x1e)
                                      ) +
                            *(float *)((long)__ptr +
                                      ((long)((uVar7 >> 0x20 & 0x1fffffff) * -0x100000000 + lVar10)
                                      >> 0x1e));
        }
        lVar10 = lVar10 + 0x100000000;
        lVar8 = lVar8 + 0xc;
      } while ((ulong)uVar2 * 0xc != lVar8);
    }
  }
  else {
    fVar12 = 0.0;
    if (1 < (int)uVar2) {
      uVar3 = pVVar6->nSize;
      uVar7 = 1;
      if (1 < (int)uVar3) {
        uVar7 = (ulong)uVar3;
      }
      uVar9 = 1;
      do {
        if (uVar9 == uVar7) {
LAB_002311bf:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar4 = pVVar6->pArray[uVar9];
        if ((ulong)uVar4 != 0) {
          if ((int)uVar3 <= (int)uVar4 || (int)uVar4 < 0) goto LAB_002311bf;
          puVar1 = (uint *)(pVVar6->pArray + uVar4);
          uVar5 = *puVar1;
          if ((int)uVar5 < 1) {
            uVar5 = 0;
          }
          uVar11 = 0;
          while (uVar5 != uVar11) {
            fVar12 = fVar12 + (float)__ptr[(int)puVar1[uVar11 + 1]];
            uVar11 = uVar11 + 1;
            if ((int)uVar3 <= (int)uVar4 || (int)uVar4 < 0) goto LAB_002311bf;
          }
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar2);
    }
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
    __ptr_00->pArray = (int *)0x0;
  }
  if (__ptr_00 != (Vec_Int_t *)0x0) {
    free(__ptr_00);
  }
  return fVar12;
}

Assistant:

float Gia_ManComputeSwitching( Gia_Man_t * p, int nFrames, int nPref, int fProbOne )
{
    Vec_Int_t * vSwitching = Gia_ManComputeSwitchProbs( p, nFrames, nPref, fProbOne );
    float * pSwi = (float *)Vec_IntArray(vSwitching), SwiTotal = 0;
    Gia_Obj_t * pObj;
    int i, k, iFan;
    if ( Gia_ManHasMapping(p) )
    {
        Gia_ManForEachLut( p, i )
            Gia_LutForEachFanin( p, i, iFan, k )
                SwiTotal += pSwi[iFan];
    }
    else
    {
        Gia_ManForEachAnd( p, pObj, i )
            SwiTotal += pSwi[Gia_ObjFaninId0(pObj, i)] + pSwi[Gia_ObjFaninId1(pObj, i)];
    }
    Vec_IntFree( vSwitching );
    return SwiTotal;
}